

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O0

ssize_t __thiscall
InputSource::read_abi_cxx11_(InputSource *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  allocator<char> local_2a;
  undefined1 local_29;
  size_t local_28;
  qpdf_offset_t at_local;
  size_t count_local;
  InputSource *this_local;
  string *result;
  
  local_29 = 0;
  local_28 = __nbytes;
  at_local = (qpdf_offset_t)__buf;
  count_local = (size_t)CONCAT44(in_register_00000034,__fd);
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,(size_type)__buf,'\0',&local_2a)
  ;
  std::allocator<char>::~allocator(&local_2a);
  read((InputSource *)CONCAT44(in_register_00000034,__fd),(int)this,(void *)at_local,local_28);
  return (ssize_t)this;
}

Assistant:

inline std::string
InputSource::read(size_t count, qpdf_offset_t at)
{
    std::string result(count, '\0');
    (void)read(result, count, at);
    return result;
}